

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int link_set_snd_settle_mode(LINK_HANDLE link,sender_settle_mode snd_settle_mode)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  sender_settle_mode snd_settle_mode_local;
  LINK_HANDLE link_local;
  
  if (link == (LINK_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"link_set_snd_settle_mode",0x3b6,1,"NULL link");
    }
    l._0_4_ = 0x3b7;
  }
  else {
    link->snd_settle_mode = snd_settle_mode;
    l._0_4_ = 0;
  }
  return (int)l;
}

Assistant:

int link_set_snd_settle_mode(LINK_HANDLE link, sender_settle_mode snd_settle_mode)
{
    int result;

    if (link == NULL)
    {
        LogError("NULL link");
        result = MU_FAILURE;
    }
    else
    {
        link->snd_settle_mode = snd_settle_mode;
        result = 0;
    }

    return result;
}